

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

Quat * __thiscall rw::Quat::rotate(Quat *this,V3d *axis,float32 angle,CombineOp op)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Quat *p;
  Quat *q;
  Quat QVar4;
  Quat rot;
  Quat local_58;
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  float local_28;
  
  local_28 = cosf((float)angle * 0.5);
  fVar1 = (float)axis->z;
  uVar2 = axis->x;
  uVar3 = axis->y;
  fStack_44 = 1.0 / SQRT(fVar1 * fVar1 + (float)uVar2 * (float)uVar2 + (float)uVar3 * (float)uVar3);
  local_38 = ZEXT416((uint)(fVar1 * fStack_44));
  local_48 = fStack_44 * (float)uVar2;
  fStack_44 = fStack_44 * (float)uVar3;
  uStack_40 = 0;
  local_58.y = (float32)sinf((float)angle * 0.5);
  local_58.z = (float32)((float)local_38._0_4_ * (float)local_58.y);
  local_58.x = (float32)((float)local_58.y * local_48);
  local_58.y = (float32)((float)local_58.y * fStack_44);
  local_58.w = (float32)local_28;
  if (op == COMBINEPOSTCONCAT) {
    q = &local_58;
    p = this;
  }
  else {
    if (op != COMBINEPRECONCAT) {
      if (op != COMBINEREPLACE) {
        return this;
      }
      this->x = local_58.x;
      this->y = local_58.y;
      this->z = local_58.z;
      this->w = (float32)local_28;
      return this;
    }
    p = &local_58;
    q = this;
  }
  QVar4 = mult(q,p);
  *this = QVar4;
  return this;
}

Assistant:

Quat*
Quat::rotate(const V3d *axis, float32 angle, CombineOp op)
{
	Quat rot = rotation(angle, *axis);
	switch(op){
	case COMBINEREPLACE:
		*this = rot;
		break;
	case COMBINEPRECONCAT:
		*this = mult(*this, rot);
		break;
	case COMBINEPOSTCONCAT:
		*this = mult(rot, *this);
		break;
	}
	return this;
}